

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

tuple<int,_int,_int> __thiscall
anon_unknown.dwarf_197e8f::preprocessor<baryonyx::problem>::reduce
          (preprocessor<baryonyx::problem> *this,constraint *constraint)

{
  long lVar1;
  _Tuple_impl<1UL,_int,_int> _Var2;
  iterator iVar3;
  _Head_base<0UL,_int,_false> in_EDX;
  int extraout_EDX;
  undefined4 in_register_00000014;
  ulong uVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  tuple<int,_int,_int> tVar8;
  uint local_3c;
  
  iVar5 = *(int *)(CONCAT44(in_register_00000014,in_EDX._M_head_impl) + 0x28);
  _Var2 = (_Tuple_impl<1UL,_int,_int>)
          (*(long *)(CONCAT44(in_register_00000014,in_EDX._M_head_impl) + 0x18) -
          *(long *)(CONCAT44(in_register_00000014,in_EDX._M_head_impl) + 0x10));
  if ((int)((ulong)_Var2 >> 3) == 0) {
    auVar7 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  }
  else {
    lVar6 = 4;
    lVar1 = CONCAT44(in_register_00000014,in_EDX._M_head_impl);
    local_3c = 0xffffffff;
    uVar4 = 0;
    do {
      iVar3 = std::
              _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&constraint->elements,(key_type *)(*(long *)(lVar1 + 0x10) + lVar6));
      if (iVar3.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
          (__node_type *)0x0) {
        if (local_3c != 0xffffffff) {
          (anonymous_namespace)::preprocessor<baryonyx::problem>::reduce();
        }
        local_3c = (uint)uVar4;
      }
      else {
        iVar5 = iVar5 - (uint)*(byte *)((long)iVar3.
                                              super__Node_iterator_base<std::pair<const_int,_bool>,_false>
                                              ._M_cur + 0xc) *
                        *(int *)(*(long *)(lVar1 + 0x10) + uVar4 * 8);
      }
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 8;
    } while (((ulong)_Var2 >> 3 & 0xffffffff) != uVar4);
    if ((int)local_3c < 0) {
      auVar7 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    }
    else {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(*(long *)(lVar1 + 0x10) + (ulong)local_3c * 8);
    }
    _Var2.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
    _Var2.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)local_3c;
    in_EDX._M_head_impl = extraout_EDX;
  }
  auVar7 = vpshufd_avx(auVar7,0xe1);
  *(int *)&this->ctx = iVar5;
  *(long *)((long)&this->ctx + 4) = auVar7._0_8_;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       in_EDX._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = _Var2;
  return (tuple<int,_int,_int>)tVar8.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

auto reduce(const bx::constraint& constraint) -> std::tuple<int, int, int>
    {
        int constraint_result{ constraint.value };
        int remaining_index{ -1 };
        int factor;
        int var_id;

        for (int i = 0, e = bx::length(constraint.elements); i != e; ++i) {

            // Searches if the variable is already affected and then use the
            // value to update the value of the constraint.

            auto it = vars.find(constraint.elements[i].variable_index);
            if (it == vars.end()) {
                bx_assert(remaining_index == -1);
                remaining_index = i;
            } else {
                constraint_result +=
                  -1 * (constraint.elements[i].factor * it->second);
            }
        }

        if (remaining_index >= 0) {
            factor = constraint.elements[remaining_index].factor;
            var_id = constraint.elements[remaining_index].variable_index;
        } else {
            factor = -1;
            var_id = -1;
        }

        return std::make_tuple(factor, var_id, constraint_result);
    }